

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::disableDigitalSignatures(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  reference this_00;
  pair<std::_Rb_tree_const_iterator<QPDFObjGen>,_bool> pVar2;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  _Base_ptr local_d0;
  undefined1 local_c8;
  QPDFObjGen local_c0;
  undefined1 local_b8 [8];
  QPDFObjectHandle oh;
  string ft;
  QPDFFormFieldObjectHelper *f;
  iterator __end1;
  iterator __begin1;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *__range1;
  undefined1 local_58 [8];
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> fields;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> to_remove;
  QPDFAcroFormDocumentHelper *this_local;
  
  QPDF::removeSecurityRestrictions((this->super_QPDFDocumentHelper).qpdf);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
             &fields.
              super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  getFormFields((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                local_58,this);
  __end1 = std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::begin
                     ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                       *)local_58);
  f = (QPDFFormFieldObjectHelper *)
      std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::end
                ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                 local_58);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
                                     *)&f), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
              ::operator*(&__end1);
    QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_
              ((string *)
               &oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,this_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oh.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                            "/Sig");
    if (bVar1) {
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_b8);
      local_c0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_b8);
      pVar2 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                        ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                         &fields.
                          super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c0);
      local_d0 = (_Base_ptr)pVar2.first._M_node;
      local_c8 = pVar2.second;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"/FT",&local_f1);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_b8,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"/V",&local_119);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_b8,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"/SV",&local_141);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_b8,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"/Lock",&local_169);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_b8,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b8);
    }
    std::__cxx11::string::~string
              ((string *)
               &oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __gnu_cxx::
    __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
    ::operator++(&__end1);
  }
  removeFormFields(this,(set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                        &fields.
                         super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
            ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
             local_58);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
             &fields.
              super__Vector_base<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::disableDigitalSignatures()
{
    qpdf.removeSecurityRestrictions();
    std::set<QPDFObjGen> to_remove;
    auto fields = getFormFields();
    for (auto& f: fields) {
        auto ft = f.getFieldType();
        if (ft == "/Sig") {
            auto oh = f.getObjectHandle();
            to_remove.insert(oh.getObjGen());
            // Make this no longer a form field. If it's also an annotation, the annotation will
            // survive. If it's only a field and is no longer referenced, it will disappear.
            oh.removeKey("/FT");
            // Remove fields that are specific to signature fields.
            oh.removeKey("/V");
            oh.removeKey("/SV");
            oh.removeKey("/Lock");
        }
    }
    removeFormFields(to_remove);
}